

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O2

void __thiscall cornerstone::peer::send_req(peer *this,ptr<req_msg> *req,rpc_handler *handler)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  rpc_handler h;
  ptr<rpc_result> pending;
  peer *local_48;
  __shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_30;
  
  std::
  make_shared<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>,std::function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>&>
            ((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
              *)&pending);
  local_48 = this;
  std::__shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_40,&req->super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::
  __shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_30,
                 (__shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&pending);
  h.super__Function_base._M_manager = (_Manager_type)0x0;
  h._M_invoker = (_Invoker_type)0x0;
  h.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  h.super__Function_base._M_functor._8_8_ = 0;
  h.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
  _Var5._M_pi = _Stack_30._M_refcount._M_pi;
  peVar4 = _Stack_30._M_ptr;
  _Var3._M_pi = _Stack_40._M_refcount._M_pi;
  peVar2 = _Stack_40._M_ptr;
  _Stack_40._M_ptr = (element_type *)0x0;
  _Stack_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_30._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(peer **)h.super__Function_base._M_functor._M_unused._0_8_ = local_48;
  *(element_type **)((long)h.super__Function_base._M_functor._M_unused._0_8_ + 8) = peVar2;
  _Stack_30._M_ptr = (element_type *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)h.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = _Var3._M_pi;
  *(element_type **)((long)h.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = peVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)h.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = _Var5._M_pi;
  h._M_invoker = std::
                 _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/peer.cxx:24:21)>
                 ::_M_invoke;
  h.super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/peer.cxx:24:21)>
       ::_M_manager;
  send_req(std::shared_ptr<cornerstone::req_msg>&,std::function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>&)
  ::$_0::~__0((__0 *)&local_48);
  peVar1 = (this->rpc_).super___shared_ptr<cornerstone::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_rpc_client[2])(peVar1,req,&h);
  std::_Function_base::~_Function_base(&h.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pending.
              super___shared_ptr<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void peer::send_req(ptr<req_msg>& req, rpc_handler& handler)
{
    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    rpc_handler h = [this, req, pending](ptr<resp_msg>& resp, const ptr<rpc_exception>& ex) mutable
    { this->handle_rpc_result(req, pending, resp, ex); };
    rpc_->send(req, h);
}